

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueueExample.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  thread t2;
  thread t1;
  MPMCQueue<int> q;
  int local_180 [2];
  type local_178;
  thread local_170;
  type local_168;
  thread local_160 [3];
  allocator<rigtorp::mpmc::Slot<int>_> local_141;
  Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> local_140;
  int local_54;
  
  local_54 = 0;
  std::allocator<rigtorp::mpmc::Slot<int>_>::allocator(&local_141);
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::Queue
            (&local_140,10,&local_141);
  std::allocator<rigtorp::mpmc::Slot<int>_>::~allocator(&local_141);
  local_168.q = &local_140;
  std::thread::thread<main::__0,,void>(local_160,&local_168);
  local_178.q = &local_140;
  std::thread::thread<main::__1,,void>(&local_170,&local_178);
  local_180[1] = 1;
  rigtorp::mpmc::Queue<int,std::allocator<rigtorp::mpmc::Slot<int>>>::push<int,void>
            ((Queue<int,std::allocator<rigtorp::mpmc::Slot<int>>> *)&local_140,local_180 + 1);
  local_180[0] = 2;
  rigtorp::mpmc::Queue<int,std::allocator<rigtorp::mpmc::Slot<int>>>::push<int,void>
            ((Queue<int,std::allocator<rigtorp::mpmc::Slot<int>>> *)&local_140,local_180);
  std::thread::join();
  std::thread::join();
  local_54 = 0;
  std::thread::~thread(&local_170);
  std::thread::~thread(local_160);
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::~Queue(&local_140);
  return local_54;
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  MPMCQueue<int> q(10);
  auto t1 = std::thread([&] {
    int v;
    q.pop(v);
    std::cout << "t1 " << v << "\n";
  });
  auto t2 = std::thread([&] {
    int v;
    q.pop(v);
    std::cout << "t2 " << v << "\n";
  });
  q.push(1);
  q.push(2);
  t1.join();
  t2.join();

  return 0;
}